

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_horz_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  UWORD8 aUVar6 [16];
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar37;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 in_XMM3 [16];
  undefined1 auVar38 [16];
  short sVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  aUVar6 = IHEVCE_SHUFFLEMASK4;
  uVar12 = (long)nt * 2;
  if (nt == 0x20) {
    lVar21 = (long)dst_strd;
    uVar18 = 0;
    bVar7 = true;
    do {
      bVar5 = bVar7;
      auVar51 = *(undefined1 (*) [16])(pu1_ref + (((uVar12 & 0xffffffff) - 0x10) - uVar18));
      auVar50 = pshufb(auVar51 >> 0x38,(undefined1  [16])aUVar6);
      auVar49 = pshufb(auVar51 >> 0x30,(undefined1  [16])aUVar6);
      auVar48 = pshufb(auVar51 >> 0x28,(undefined1  [16])aUVar6);
      auVar47 = pshufb(auVar51 >> 0x20,(undefined1  [16])aUVar6);
      auVar38 = pshufb(auVar51 >> 0x18,(undefined1  [16])aUVar6);
      auVar35 = pshufb(auVar51 >> 0x10,(undefined1  [16])aUVar6);
      auVar36 = pshufb(auVar51 >> 8,(undefined1  [16])aUVar6);
      auVar34 = pshufb(auVar51,(undefined1  [16])aUVar6);
      auVar46 = pshufb(auVar51 >> 0x78,(undefined1  [16])aUVar6);
      auVar57 = pshufb(auVar51 >> 0x70,(undefined1  [16])aUVar6);
      auVar56 = pshufb(auVar51 >> 0x68,(undefined1  [16])aUVar6);
      auVar55 = pshufb(auVar51 >> 0x60,(undefined1  [16])aUVar6);
      auVar54 = pshufb(auVar51 >> 0x58,(undefined1  [16])aUVar6);
      auVar53 = pshufb(auVar51 >> 0x50,(undefined1  [16])aUVar6);
      auVar52 = pshufb(auVar51 >> 0x48,(undefined1  [16])aUVar6);
      auVar51 = pshufb(auVar51 >> 0x40,(undefined1  [16])aUVar6);
      *(undefined1 (*) [16])(pu1_dst + uVar18 * lVar21) = auVar46;
      lVar8 = (uVar18 | 1) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar8) = auVar57;
      lVar9 = (uVar18 | 2) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar9) = auVar56;
      lVar10 = (uVar18 | 3) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar10) = auVar55;
      lVar14 = (uVar18 | 4) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar14) = auVar54;
      lVar24 = (uVar18 | 5) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar24) = auVar53;
      lVar25 = (uVar18 | 6) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar25) = auVar52;
      lVar22 = (uVar18 | 7) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar22) = auVar51;
      lVar23 = (uVar18 | 8) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar23) = auVar50;
      lVar15 = (uVar18 | 9) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar15) = auVar49;
      lVar11 = (uVar18 | 10) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar11) = auVar48;
      lVar16 = (uVar18 | 0xb) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar16) = auVar47;
      lVar13 = (uVar18 | 0xc) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar13) = auVar38;
      lVar19 = (uVar18 | 0xd) * lVar21;
      local_48 = auVar35._0_8_;
      uStack_40 = auVar35._8_8_;
      *(undefined8 *)(pu1_dst + lVar19) = local_48;
      *(undefined8 *)(pu1_dst + lVar19 + 8) = uStack_40;
      lVar20 = (uVar18 | 0xe) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar20) = auVar36;
      lVar17 = (uVar18 | 0xf) * lVar21;
      *(undefined1 (*) [16])(pu1_dst + lVar17) = auVar34;
      *(undefined1 (*) [16])(pu1_dst + uVar18 * lVar21 + 0x10) = auVar46;
      *(undefined1 (*) [16])(pu1_dst + lVar8 + 0x10) = auVar57;
      *(undefined1 (*) [16])(pu1_dst + lVar9 + 0x10) = auVar56;
      *(undefined1 (*) [16])(pu1_dst + lVar10 + 0x10) = auVar55;
      *(undefined1 (*) [16])(pu1_dst + lVar14 + 0x10) = auVar54;
      *(undefined1 (*) [16])(pu1_dst + lVar24 + 0x10) = auVar53;
      *(undefined1 (*) [16])(pu1_dst + lVar25 + 0x10) = auVar52;
      *(undefined1 (*) [16])(pu1_dst + lVar22 + 0x10) = auVar51;
      *(undefined1 (*) [16])(pu1_dst + lVar23 + 0x10) = auVar50;
      *(undefined1 (*) [16])(pu1_dst + lVar15 + 0x10) = auVar49;
      *(undefined1 (*) [16])(pu1_dst + lVar11 + 0x10) = auVar48;
      *(undefined1 (*) [16])(pu1_dst + lVar16 + 0x10) = auVar47;
      local_58 = auVar38._0_8_;
      uStack_50 = auVar38._8_8_;
      *(undefined8 *)(pu1_dst + lVar13 + 0x10) = local_58;
      *(undefined8 *)(pu1_dst + lVar13 + 0x10 + 8) = uStack_50;
      *(undefined8 *)(pu1_dst + lVar19 + 0x10) = local_48;
      *(undefined8 *)(pu1_dst + lVar19 + 0x10 + 8) = uStack_40;
      *(undefined1 (*) [16])(pu1_dst + lVar20 + 0x10) = auVar36;
      *(undefined1 (*) [16])(pu1_dst + lVar17 + 0x10) = auVar34;
      uVar18 = 0x10;
      bVar7 = false;
    } while (bVar5);
    return;
  }
  auVar51 = pshuflw(ZEXT116(pu1_ref[uVar12 - 1]),ZEXT116(pu1_ref[uVar12 - 1]),0);
  auVar34 = pshuflw(ZEXT116(pu1_ref[uVar12]),ZEXT116(pu1_ref[uVar12]),0);
  auVar35 = pmovzxbw(auVar34,*(undefined8 *)(pu1_ref + uVar12 + 1));
  sVar37 = auVar34._0_2_;
  auVar36._0_2_ = auVar35._0_2_ - sVar37;
  sVar39 = auVar34._2_2_;
  auVar36._2_2_ = auVar35._2_2_ - sVar39;
  auVar36._4_2_ = auVar35._4_2_ - sVar37;
  auVar36._6_2_ = auVar35._6_2_ - sVar39;
  auVar36._8_2_ = auVar35._8_2_ - sVar37;
  auVar36._10_2_ = auVar35._10_2_ - sVar39;
  auVar36._12_2_ = auVar35._12_2_ - sVar37;
  auVar36._14_2_ = auVar35._14_2_ - sVar39;
  auVar34 = psraw(auVar36,1);
  sVar44 = auVar51._0_2_;
  sVar26 = auVar34._0_2_ + sVar44;
  sVar45 = auVar51._2_2_;
  sVar27 = auVar34._2_2_ + sVar45;
  sVar28 = auVar34._4_2_ + sVar44;
  sVar29 = auVar34._6_2_ + sVar45;
  sVar30 = auVar34._8_2_ + sVar44;
  sVar31 = auVar34._10_2_ + sVar45;
  sVar32 = auVar34._12_2_ + sVar44;
  sVar33 = auVar34._14_2_ + sVar45;
  cVar1 = (char)sVar26;
  cVar2 = (char)sVar27;
  cVar3 = (char)sVar28;
  cVar4 = (char)sVar29;
  if (nt == 0x10) {
    auVar51 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + uVar12 + 9));
    auVar34._0_2_ = auVar51._0_2_ - sVar37;
    auVar34._2_2_ = auVar51._2_2_ - sVar39;
    auVar34._4_2_ = auVar51._4_2_ - sVar37;
    auVar34._6_2_ = auVar51._6_2_ - sVar39;
    auVar34._8_2_ = auVar51._8_2_ - sVar37;
    auVar34._10_2_ = auVar51._10_2_ - sVar39;
    auVar34._12_2_ = auVar51._12_2_ - sVar37;
    auVar34._14_2_ = auVar51._14_2_ - sVar39;
    auVar51 = psraw(auVar34,1);
    sVar37 = auVar51._0_2_ + sVar44;
    sVar39 = auVar51._2_2_ + sVar45;
    sVar40 = auVar51._4_2_ + sVar44;
    sVar41 = auVar51._6_2_ + sVar45;
    sVar42 = auVar51._8_2_ + sVar44;
    sVar43 = auVar51._10_2_ + sVar45;
    sVar44 = auVar51._12_2_ + sVar44;
    sVar45 = auVar51._14_2_ + sVar45;
    *pu1_dst = (0 < sVar26) * (sVar26 < 0x100) * cVar1 - (0xff < sVar26);
    pu1_dst[1] = (0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27);
    pu1_dst[2] = (0 < sVar28) * (sVar28 < 0x100) * cVar3 - (0xff < sVar28);
    pu1_dst[3] = (0 < sVar29) * (sVar29 < 0x100) * cVar4 - (0xff < sVar29);
    pu1_dst[4] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
    pu1_dst[5] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
    pu1_dst[6] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
    pu1_dst[7] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
    pu1_dst[8] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
    pu1_dst[9] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
    pu1_dst[10] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
    pu1_dst[0xb] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
    pu1_dst[0xc] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
    pu1_dst[0xd] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
    pu1_dst[0xe] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
    pu1_dst[0xf] = (0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45);
    uVar12 = uVar12 & 0xffffffff;
    auVar51 = pshufb(ZEXT116(pu1_ref[uVar12 - 2]),(undefined1  [16])0x0);
    auVar34 = pshufb(ZEXT116(pu1_ref[uVar12 - 3]),(undefined1  [16])0x0);
    auVar35 = pshufb(ZEXT116(pu1_ref[uVar12 - 4]),(undefined1  [16])0x0);
    auVar36 = pshufb(ZEXT116(pu1_ref[uVar12 - 5]),(undefined1  [16])0x0);
    auVar38 = pshufb(ZEXT116(pu1_ref[uVar12 - 6]),(undefined1  [16])0x0);
    auVar46 = pshufb(ZEXT116(pu1_ref[uVar12 - 7]),(undefined1  [16])0x0);
    auVar47 = pshufb(ZEXT116(pu1_ref[uVar12 - 8]),(undefined1  [16])0x0);
    auVar48 = pshufb(ZEXT116(pu1_ref[uVar12 - 9]),(undefined1  [16])0x0);
    lVar21 = (long)dst_strd;
    *(undefined1 (*) [16])(pu1_dst + lVar21) = auVar51;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 2) = auVar34;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 3) = auVar35;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 4) = auVar36;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 5) = auVar38;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 6) = auVar46;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 7) = auVar47;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 8) = auVar48;
    auVar51 = pshufb(ZEXT116(pu1_ref[uVar12 - 10]),(undefined1  [16])0x0);
    auVar34 = pshufb(ZEXT116(pu1_ref[uVar12 - 0xb]),(undefined1  [16])0x0);
    auVar35 = pshufb(ZEXT116(pu1_ref[uVar12 - 0xc]),(undefined1  [16])0x0);
    auVar36 = pshufb(ZEXT116(pu1_ref[uVar12 - 0xd]),(undefined1  [16])0x0);
    auVar38 = pshufb(ZEXT116(pu1_ref[uVar12 - 0xe]),(undefined1  [16])0x0);
    auVar46 = pshufb(ZEXT116(pu1_ref[uVar12 - 0xf]),(undefined1  [16])0x0);
    auVar47 = pshufb(ZEXT116(pu1_ref[uVar12 - 0x10]),(undefined1  [16])0x0);
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 9) = auVar51;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 10) = auVar34;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 0xb) = auVar35;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 0xc) = auVar36;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 0xd) = auVar38;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 0xe) = auVar46;
    *(undefined1 (*) [16])(pu1_dst + lVar21 * 0xf) = auVar47;
  }
  else {
    if (nt == 8) {
      uVar12 = uVar12 & 0xffffffff;
      auVar51 = pshufb(ZEXT116(pu1_ref[uVar12 - 2]),(undefined1  [16])0x0);
      auVar34 = pshufb(ZEXT116(pu1_ref[uVar12 - 3]),(undefined1  [16])0x0);
      auVar35 = pshufb(ZEXT116(pu1_ref[uVar12 - 4]),(undefined1  [16])0x0);
      auVar36 = pshufb(ZEXT116(pu1_ref[uVar12 - 5]),(undefined1  [16])0x0);
      auVar38 = pshufb(ZEXT116(pu1_ref[uVar12 - 6]),(undefined1  [16])0x0);
      auVar46 = pshufb(ZEXT116(pu1_ref[uVar12 - 7]),(undefined1  [16])0x0);
      auVar47 = pshufb(ZEXT116(pu1_ref[uVar12 - 8]),(undefined1  [16])0x0);
      *(ulong *)pu1_dst =
           CONCAT17((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                    CONCAT16((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32),
                             CONCAT15((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 -
                                      (0xff < sVar31),
                                      CONCAT14((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 -
                                               (0xff < sVar30),
                                               CONCAT13((0 < sVar29) * (sVar29 < 0x100) * cVar4 -
                                                        (0xff < sVar29),
                                                        CONCAT12((0 < sVar28) * (sVar28 < 0x100) *
                                                                 cVar3 - (0xff < sVar28),
                                                                 CONCAT11((0 < sVar27) *
                                                                          (sVar27 < 0x100) * cVar2 -
                                                                          (0xff < sVar27),
                                                                          (0 < sVar26) *
                                                                          (sVar26 < 0x100) * cVar1 -
                                                                          (0xff < sVar26))))))));
      lVar21 = (long)dst_strd;
      *(long *)(pu1_dst + lVar21) = auVar51._0_8_;
      *(long *)(pu1_dst + lVar21 * 2) = auVar34._0_8_;
      *(long *)(pu1_dst + lVar21 * 3) = auVar35._0_8_;
      *(long *)(pu1_dst + lVar21 * 4) = auVar36._0_8_;
      *(long *)(pu1_dst + lVar21 * 5) = auVar38._0_8_;
      *(long *)(pu1_dst + lVar21 * 6) = auVar46._0_8_;
      *(long *)(pu1_dst + lVar21 * 7) = auVar47._0_8_;
      return;
    }
    if (nt == 4) {
      *(uint *)pu1_dst =
           CONCAT13((0 < sVar29) * (sVar29 < 0x100) * cVar4 - (0xff < sVar29),
                    CONCAT12((0 < sVar28) * (sVar28 < 0x100) * cVar3 - (0xff < sVar28),
                             CONCAT11((0 < sVar27) * (sVar27 < 0x100) * cVar2 - (0xff < sVar27),
                                      (0 < sVar26) * (sVar26 < 0x100) * cVar1 - (0xff < sVar26))));
      uVar12 = uVar12 & 0xffffffff;
      auVar51 = pshufb(ZEXT116(pu1_ref[uVar12 - 2]),(undefined1  [16])0x0);
      auVar34 = pshufb(ZEXT116(pu1_ref[uVar12 - 3]),(undefined1  [16])0x0);
      auVar35 = pshufb(ZEXT116(pu1_ref[uVar12 - 4]),(undefined1  [16])0x0);
      lVar21 = (long)dst_strd;
      *(int *)(pu1_dst + lVar21) = auVar51._0_4_;
      *(int *)(pu1_dst + lVar21 * 2) = auVar34._0_4_;
      *(int *)(pu1_dst + lVar21 * 3) = auVar35._0_4_;
      return;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 row;
    WORD32 two_nt;
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;


    if(nt == 32)
    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
        __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
        __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        for(row = 0; row < nt; row += 16)
        {
            {
                src_temp1 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 - row - 15));

                src_temp2 =  _mm_srli_si128(src_temp1, 1);
                src_temp3 =  _mm_srli_si128(src_temp1, 2);
                src_temp4 =  _mm_srli_si128(src_temp1, 3);
                src_temp5 =  _mm_srli_si128(src_temp1, 4);
                src_temp6 =  _mm_srli_si128(src_temp1, 5);
                src_temp7 =  _mm_srli_si128(src_temp1, 6);
                src_temp8 =  _mm_srli_si128(src_temp1, 7);

                src_temp9 =  _mm_srli_si128(src_temp1, 8);
                src_temp10 =  _mm_srli_si128(src_temp1, 9);
                src_temp11 =  _mm_srli_si128(src_temp1, 10);
                src_temp12 =  _mm_srli_si128(src_temp1, 11);
                src_temp13 =  _mm_srli_si128(src_temp1, 12);
                src_temp14 =  _mm_srli_si128(src_temp1, 13);
                src_temp15 =  _mm_srli_si128(src_temp1, 14);
                src_temp16 =  _mm_srli_si128(src_temp1, 15);

                src_temp8 =  _mm_shuffle_epi8(src_temp8, sm);
                src_temp7 =  _mm_shuffle_epi8(src_temp7, sm);
                src_temp6 =  _mm_shuffle_epi8(src_temp6, sm);
                src_temp5 =  _mm_shuffle_epi8(src_temp5, sm);
                src_temp4 =  _mm_shuffle_epi8(src_temp4, sm);
                src_temp3 =  _mm_shuffle_epi8(src_temp3, sm);
                src_temp2 =  _mm_shuffle_epi8(src_temp2, sm);
                src_temp1 =  _mm_shuffle_epi8(src_temp1, sm);

                src_temp16 =  _mm_shuffle_epi8(src_temp16, sm);
                src_temp15 =  _mm_shuffle_epi8(src_temp15, sm);
                src_temp14 =  _mm_shuffle_epi8(src_temp14, sm);
                src_temp13 =  _mm_shuffle_epi8(src_temp13, sm);
                src_temp12 =  _mm_shuffle_epi8(src_temp12, sm);
                src_temp11 =  _mm_shuffle_epi8(src_temp11, sm);
                src_temp10 =  _mm_shuffle_epi8(src_temp10, sm);
                src_temp9 =  _mm_shuffle_epi8(src_temp9, sm);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 15) * dst_strd)), src_temp1);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 15) * dst_strd)), src_temp1);

            }

        }

    }
    else

    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6;
        __m128i src_temp10, zero_8x16b, src_temp7;

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        /*Filtering done for the 1st row */

        src_temp2 =  _mm_set1_epi16(pu1_ref[two_nt - 1]);
        src_temp10 =  _mm_set1_epi16(pu1_ref[two_nt]);

        /*  loding 8-bit 16 pixels */
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        /*(pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt])*/
        src_temp3 = _mm_sub_epi16(src_temp4, src_temp10);

        /* ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_srai_epi16(src_temp3, 1);

        /* pu1_ref[two_nt - 1]+((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_add_epi16(src_temp2, src_temp3);

        if(nt == 4)
        {
            int temp1, temp2, temp3;
            src_temp3 = _mm_packus_epi16(src_temp3, zero_8x16b);
            temp1 = _mm_cvtsi128_si32(src_temp3);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8)
        {
            src_temp10 = _mm_packus_epi16(src_temp3, zero_8x16b);


            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp10);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp7);

        }
        else if(nt == 16)
        {
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

            src_temp10 = _mm_sub_epi16(src_temp4, src_temp10);
            src_temp10 = _mm_srai_epi16(src_temp10, 1);
            src_temp10 = _mm_add_epi16(src_temp2, src_temp10);

            src_temp3 = _mm_packus_epi16(src_temp3, src_temp10);
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp3);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);
            src_temp10 =  _mm_set1_epi8(pu1_ref[two_nt - 9]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp10);

            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 10]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 11]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 12]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 13]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 14]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 15]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 16]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp7);

        }
    }
}